

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editline.c
# Opt level: O3

el_status_t insert_string(char *p)

{
  char *__ptr;
  size_t __n;
  size_t __n_00;
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  size_t __size;
  
  __n_00 = strlen(p);
  iVar3 = rl_end;
  __n = Length;
  pcVar1 = rl_line_buffer;
  __size = Length;
  if (Length <= (long)rl_end + __n_00) {
    __size = __n_00 + Length + 0x40;
    pcVar1 = (char *)malloc(__size);
    __ptr = rl_line_buffer;
    if (pcVar1 == (char *)0x0) {
      return CSstay;
    }
    if (__n != 0) {
      memcpy(pcVar1,rl_line_buffer,__n);
      free(__ptr);
      iVar3 = rl_end;
    }
  }
  Length = __size;
  rl_line_buffer = pcVar1;
  pcVar1 = rl_line_buffer;
  lVar4 = (long)rl_point;
  if (iVar3 - rl_point != 0 && rl_point <= iVar3) {
    uVar2 = (ulong)(uint)(iVar3 - rl_point);
    iVar3 = (iVar3 - rl_point) + 1;
    do {
      uVar2 = uVar2 - 1;
      pcVar1[(uVar2 & 0xffffffff) + __n_00 + lVar4] = pcVar1[(uVar2 & 0xffffffff) + lVar4];
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
    lVar4 = (long)rl_point;
  }
  memcpy(rl_line_buffer + lVar4,p,__n_00);
  rl_end = rl_end + (int)__n_00;
  rl_line_buffer[rl_end] = '\0';
  tty_string(rl_line_buffer + rl_point);
  rl_point = rl_point + (int)__n_00;
  return (uint)(rl_point == rl_end) * 2 + CSmove;
}

Assistant:

static el_status_t insert_string(const char *p)
{
    size_t      len;
    int         i;
    char        *line;
    char        *q;

    len = strlen(p);
    if (rl_end + len >= Length) {
        line = malloc(sizeof(char) * (Length + len + MEM_INC));
        if (!line)
            return CSstay;

        if (Length) {
            memcpy(line, rl_line_buffer, Length);
            free(rl_line_buffer);
        }

        rl_line_buffer = line;
        Length += len + MEM_INC;
    }

    for (q = &rl_line_buffer[rl_point], i = rl_end - rl_point; --i >= 0; )
        q[len + i] = q[i];

    memcpy(&rl_line_buffer[rl_point], p, len);
    rl_end += len;
    rl_line_buffer[rl_end] = '\0';
    tty_string(&rl_line_buffer[rl_point]);
    rl_point += len;

    return rl_point == rl_end ? CSstay : CSmove;
}